

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::UncoreMinimize::pushTrim(Clasp::Solver&)::Limit::propagateFixpoint(Clasp::Solver&,Clasp::
PostPropagator__(void *this,Solver *s,PostPropagator *ctx)

{
  uint *puVar1;
  bool bVar2;
  
  if (ctx != (PostPropagator *)0x0) {
    return true;
  }
  bVar2 = *(ulong *)((long)this + 0x18) <= (s->stats).super_CoreStats.conflicts;
  if (bVar2) {
    Solver::setStopConflict(s);
    puVar1 = (uint *)(*(long *)((long)this + 0x10) + 0xec);
    *puVar1 = *puVar1 | 0x10000000;
    *(undefined8 *)((long)this + 0x10) = 0;
    Solver::removePost(s,(PostPropagator *)this);
  }
  return !bVar2;
}

Assistant:

bool propagateFixpoint(Clasp::Solver& s, Clasp::PostPropagator* ctx) {
				if (ctx || s.stats.conflicts < limit) { return true; }
				s.setStopConflict();
				self->next_ = 1;
				self = 0;
				s.removePost(this);
				return false;
			}